

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::create_process_line
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
           *this,byte_span info,size_t stride)

{
  color_transformation cVar1;
  uint32_t bits_per_pixel;
  bool bVar2;
  process_transformed<charls::transform_hp1<unsigned_short>_> *this_00;
  frame_info *raw_data;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
  *this_01;
  size_t in_R8;
  
  raw_data = (frame_info *)info.size;
  this_01 = (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
             *)info.data;
  bVar2 = is_interleaved(this_01);
  if (bVar2) {
    cVar1 = (this_01->super_encoder_strategy).parameters_.transformation;
    if (cVar1 == None) {
      this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x70);
      process_transformed<charls::transform_none<unsigned_short>_>::process_transformed
                ((process_transformed<charls::transform_none<unsigned_short>_> *)this_00,raw_data,
                 stride);
    }
    else {
      if ((this_01->super_encoder_strategy).frame_info_.bits_per_sample != 0x10) {
        impl::throw_jpegls_error(bit_depth_for_transform_not_supported);
      }
      if (cVar1 == HP3) {
        this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp3<unsigned_short>_>::process_transformed
                  ((process_transformed<charls::transform_hp3<unsigned_short>_> *)this_00,raw_data,
                   stride);
      }
      else if (cVar1 == HP2) {
        this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp2<unsigned_short>_>::process_transformed
                  ((process_transformed<charls::transform_hp2<unsigned_short>_> *)this_00,raw_data,
                   stride);
      }
      else {
        if (cVar1 != HP1) {
          impl::throw_jpegls_error(UnsupportedColorTransform);
        }
        this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp1<unsigned_short>_>::process_transformed
                  (this_00,raw_data,stride);
      }
    }
  }
  else {
    bits_per_pixel = (this_01->super_encoder_strategy).frame_info_.bits_per_sample;
    if (bits_per_pixel == 0x10) {
      this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x20);
      (this_00->super_process_line)._vptr_process_line = (_func_int **)&PTR__process_line_0013b320;
      this_00->frame_info_ = raw_data;
      this_00->parameters_ = (coding_parameters *)0x2;
      this_00->stride_ = in_R8;
    }
    else {
      this_00 = (process_transformed<charls::transform_hp1<unsigned_short>_> *)operator_new(0x28);
      post_process_single_component_masked::post_process_single_component_masked
                ((post_process_single_component_masked *)this_00,raw_data,in_R8,2,bits_per_pixel);
    }
  }
  (this->super_encoder_strategy)._vptr_encoder_strategy = (_func_int **)this_00;
  return (__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
          )(__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<process_line> create_process_line(byte_span info, const size_t stride) override
    {
        if (!is_interleaved())
        {
            if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
            {
                return std::make_unique<post_process_single_component>(info.data, stride,
                                                                       sizeof(typename Traits::pixel_type));
            }

            return std::make_unique<post_process_single_component_masked>(
                info.data, stride, sizeof(typename Traits::pixel_type), frame_info().bits_per_sample);
        }

        if (parameters().transformation == color_transformation::none)
            return std::make_unique<process_transformed<transform_none<typename Traits::sample_type>>>(
                info, stride, frame_info(), parameters(), transform_none<sample_type>());

        if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
        {
            switch (parameters().transformation)
            {
            case color_transformation::hp1:
                return std::make_unique<process_transformed<transform_hp1<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp1<sample_type>());
            case color_transformation::hp2:
                return std::make_unique<process_transformed<transform_hp2<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp2<sample_type>());
            case color_transformation::hp3:
                return std::make_unique<process_transformed<transform_hp3<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp3<sample_type>());
            default:
                impl::throw_jpegls_error(jpegls_errc::color_transform_not_supported);
            }
        }

        impl::throw_jpegls_error(jpegls_errc::bit_depth_for_transform_not_supported);
    }